

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O1

Normalizer2Impl * icu_63::Normalizer2Factory::getNFKCImpl(UErrorCode *errorCode)

{
  undefined8 *puVar1;
  Normalizer2Impl *pNVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_initOnce<char_const*>((UInitOnce *)&nfkcInitOnce,initSingletons,"nfkc",errorCode);
    puVar1 = nfkcSingleton;
  }
  else {
    puVar1 = (undefined8 *)0x0;
  }
  if (puVar1 == (undefined8 *)0x0) {
    pNVar2 = (Normalizer2Impl *)0x0;
  }
  else {
    pNVar2 = (Normalizer2Impl *)*puVar1;
  }
  return pNVar2;
}

Assistant:

const Normalizer2Impl *
Normalizer2Factory::getNFKCImpl(UErrorCode &errorCode) {
    const Norm2AllModes *allModes=Norm2AllModes::getNFKCInstance(errorCode);
    return allModes!=NULL ? allModes->impl : NULL;
}